

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::WriteChaptersCueTimings(FILE *f,Chapters *chapters,Atom *atom)

{
  bool bVar1;
  int iVar2;
  longlong time_ns;
  longlong time_ns_00;
  
  time_ns = mkvparser::Chapters::Atom::GetStartTime(atom,chapters);
  if ((((-1 < time_ns) &&
       (time_ns_00 = mkvparser::Chapters::Atom::GetStopTime(atom,chapters), -1 < time_ns_00)) &&
      (bVar1 = WriteCueTime(f,time_ns), bVar1)) &&
     ((iVar2 = fputs(" --> ",(FILE *)f), -1 < iVar2 && (bVar1 = WriteCueTime(f,time_ns_00), bVar1)))
     ) {
    iVar2 = fputc(10,(FILE *)f);
    return -1 < iVar2;
  }
  return false;
}

Assistant:

bool vttdemux::WriteChaptersCueTimings(FILE* f,
                                       const mkvparser::Chapters* chapters,
                                       const mkvparser::Chapters::Atom* atom) {
  const mkvtime_t start_ns = atom->GetStartTime(chapters);

  if (start_ns < 0)
    return false;

  const mkvtime_t stop_ns = atom->GetStopTime(chapters);

  if (stop_ns < 0)
    return false;

  if (!WriteCueTime(f, start_ns))
    return false;

  if (fputs(" --> ", f) < 0)
    return false;

  if (!WriteCueTime(f, stop_ns))
    return false;

  if (fputc('\n', f) < 0)
    return false;

  return true;
}